

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicDispatchIndirect::CheckBinding
          (BasicDispatchIndirect *this,GLuint expected)

{
  CallLogWrapper *this_00;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLdouble d;
  GLint64 i64;
  GLboolean local_31;
  float local_30;
  GLuint local_2c;
  double local_28;
  GLuint local_20 [2];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90ef,(GLint *)&local_2c);
  if ((((local_2c == expected) &&
       (glu::CallLogWrapper::glGetInteger64v(this_00,0x90ef,(GLint64 *)local_20),
       local_20[0] == expected)) &&
      (glu::CallLogWrapper::glGetFloatv(this_00,0x90ef,&local_30),
      (GLuint)(long)local_30 == expected)) &&
     (glu::CallLogWrapper::glGetDoublev(this_00,0x90ef,&local_28),
     (GLuint)(long)local_28 == expected)) {
    glu::CallLogWrapper::glGetBooleanv(this_00,0x90ef,&local_31);
    return (bool)local_31 == (expected != 0);
  }
  return false;
}

Assistant:

bool CheckBinding(GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegerv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i);
		if (static_cast<GLuint>(i) != expected)
		{
			return false;
		}
		glGetInteger64v(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i64);
		if (static_cast<GLuint>(i64) != expected)
		{
			return false;
		}
		glGetFloatv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &f);
		if (static_cast<GLuint>(f) != expected)
		{
			return false;
		}
		glGetDoublev(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &d);
		if (static_cast<GLuint>(d) != expected)
		{
			return false;
		}
		glGetBooleanv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &b);
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
		{
			return false;
		}

		return true;
	}